

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_movem_32_re_aw(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  uVar1 = m68ki_read_imm_16();
  uVar2 = m68ki_read_imm_16();
  uVar2 = (uint)(short)uVar2;
  iVar3 = 0;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    if ((uVar1 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
      m68ki_write_32_fc(uVar2,m68ki_cpu.s_flag | 1,m68ki_cpu.dar[lVar4]);
      uVar2 = uVar2 + 4;
      iVar3 = iVar3 + 1;
    }
  }
  m68ki_remaining_cycles = m68ki_remaining_cycles - (iVar3 << ((byte)m68ki_cpu.cyc_movem_l & 0x1f));
  return;
}

Assistant:

static void m68k_op_movem_32_re_aw(void)
{
	uint i = 0;
	uint register_list = OPER_I_16();
	uint ea = EA_AW_32();
	uint count = 0;

	for(; i < 16; i++)
		if(register_list & (1 << i))
		{
			m68ki_write_32(ea, REG_DA[i]);
			ea += 4;
			count++;
		}

	USE_CYCLES(count<<CYC_MOVEM_L);
}